

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::mark_class_closures
          (Omega_h *this,Mesh *mesh,Int class_dim,vector<int,_std::allocator<int>_> *class_ids,
          Graph *nodes2ents)

{
  undefined8 uVar1;
  void *extraout_RDX;
  char *pcVar2;
  Read<signed_char> RVar3;
  Read<signed_char> eq_marks;
  Write<signed_char> local_50;
  Write<signed_char> local_40;
  Graph local_30;
  
  if ((nodes2ents->a2ab).write_.shared_alloc_.direct_ptr == (void *)0x0) {
    pcVar2 = "nodes2ents.a2ab.exists()";
    uVar1 = 0x8f;
  }
  else {
    if ((nodes2ents->ab2b).write_.shared_alloc_.direct_ptr != (void *)0x0) {
      get_eq_marks((Omega_h *)&local_40,mesh,class_dim,class_ids);
      Graph::Graph(&local_30,nodes2ents);
      Write<signed_char>::Write(&local_50,&local_40);
      mark_down(this,&local_30,(Read<signed_char> *)&local_50);
      Write<signed_char>::~Write(&local_50);
      Graph::~Graph(&local_30);
      Write<signed_char>::~Write(&local_40);
      RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
      RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
      return (Read<signed_char>)RVar3.write_.shared_alloc_;
    }
    pcVar2 = "nodes2ents.ab2b.exists()";
    uVar1 = 0x90;
  }
  fail("assertion %s failed at %s +%d\n",pcVar2,
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mark.cpp"
       ,uVar1);
}

Assistant:

Read<I8> mark_by_class_dim(Mesh* mesh, Int ent_dim, Int class_dim) {
  auto e2class_dim = mesh->get_array<I8>(ent_dim, "class_dim");
  return each_eq_to(e2class_dim, static_cast<I8>(class_dim));
}